

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::seedIdMap(TIntermediate *this,TIdMaps *idMaps,longlong *idShift)

{
  ulong uVar1;
  TIntermAggregate *pTVar2;
  undefined1 local_a8 [8];
  TUserIdTraverser userIdTraverser;
  TBuiltInIdTraverser builtInIdTraverser;
  longlong *idShift_local;
  TIdMaps *idMaps_local;
  TIntermediate *this_local;
  
  TBuiltInIdTraverser::TBuiltInIdTraverser((TBuiltInIdTraverser *)&userIdTraverser.idMaps,idMaps);
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&userIdTraverser.idMaps);
  uVar1 = TBuiltInIdTraverser::getIdShift((TBuiltInIdTraverser *)&userIdTraverser.idMaps);
  *idShift = uVar1 & 0xffffffffffffff;
  TUserIdTraverser::TUserIdTraverser((TUserIdTraverser *)local_a8,idMaps);
  pTVar2 = findLinkerObjects(this);
  (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[2])
            (pTVar2,local_a8);
  TUserIdTraverser::~TUserIdTraverser((TUserIdTraverser *)local_a8);
  TBuiltInIdTraverser::~TBuiltInIdTraverser((TBuiltInIdTraverser *)&userIdTraverser.idMaps);
  return;
}

Assistant:

void TIntermediate::seedIdMap(TIdMaps& idMaps, long long& idShift)
{
    // all built-ins everywhere need to align on IDs and contribute to the max ID
    TBuiltInIdTraverser builtInIdTraverser(idMaps);
    treeRoot->traverse(&builtInIdTraverser);
    idShift = builtInIdTraverser.getIdShift() & TSymbolTable::uniqueIdMask;

    // user variables in the linker object list need to align on ids
    TUserIdTraverser userIdTraverser(idMaps);
    findLinkerObjects()->traverse(&userIdTraverser);
}